

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

int Nf_SetAddCut(Nf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  uint uVar1;
  Nf_Cut_t *pNVar2;
  Nf_Cut_t *pNVar3;
  bool bVar4;
  int iVar5;
  Nf_Cut_t *t;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  if (nCuts == 0) {
    return 1;
  }
  if (0 < nCuts) {
    uVar6 = 0;
    bVar4 = false;
    do {
      pNVar2 = pCuts[(uint)nCuts];
      uVar7 = *(uint *)&pNVar2->field_0x10 >> 0x1b;
      pNVar3 = pCuts[uVar6];
      uVar1 = *(uint *)&pNVar3->field_0x10;
      uVar11 = uVar1 >> 0x1b;
      if ((uVar7 < uVar11) && ((pNVar2->Sign & ~pNVar3->Sign) == 0)) {
        if (uVar11 == uVar7) {
          if (0x7ffffff < uVar1) {
            uVar8 = 0;
            do {
              if (pNVar3->pLeaves[uVar8] != pNVar2->pLeaves[uVar8]) goto LAB_0072e938;
              uVar8 = uVar8 + 1;
            } while (uVar11 != uVar8);
          }
        }
        else if (0x7ffffff < *(uint *)&pNVar2->field_0x10) {
          uVar8 = 0;
          uVar9 = 0;
          do {
            if (pNVar2->pLeaves[(int)uVar9] < pNVar3->pLeaves[uVar8]) break;
            if ((pNVar3->pLeaves[uVar8] == pNVar2->pLeaves[(int)uVar9]) &&
               (uVar9 = uVar9 + 1, uVar9 == uVar7)) goto LAB_0072e927;
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
          goto LAB_0072e938;
        }
LAB_0072e927:
        *(uint *)&pNVar3->field_0x10 = uVar1 | 0xf8000000;
        bVar4 = true;
      }
LAB_0072e938:
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nCuts);
    if (bVar4) {
      uVar6 = 0;
      iVar5 = 0;
      do {
        if (*(uint *)&pCuts[uVar6]->field_0x10 < 0xf8000000) {
          lVar10 = (long)iVar5;
          if (lVar10 < (long)uVar6) {
            pNVar2 = pCuts[lVar10];
            pCuts[lVar10] = pCuts[uVar6];
            pCuts[uVar6] = pNVar2;
          }
          iVar5 = iVar5 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (nCuts + 1 != uVar6);
      nCuts = iVar5 - 1;
    }
  }
  uVar1 = nCuts;
  if (0 < nCuts) {
    while( true ) {
      pNVar2 = pCuts[(ulong)uVar1 - 1];
      pNVar3 = pCuts[uVar1];
      uVar11 = *(uint *)&pNVar2->field_0x10 >> 0x1a & 1;
      uVar7 = *(uint *)&pNVar3->field_0x10 >> 0x1a & 1;
      if (uVar11 < uVar7) break;
      if (uVar11 <= uVar7) {
        if (pNVar2->Flow < pNVar3->Flow) break;
        if (pNVar2->Flow <= pNVar3->Flow) {
          if ((pNVar2->Delay < pNVar3->Delay) ||
             ((pNVar2->Delay <= pNVar3->Delay &&
              (*(uint *)&pNVar2->field_0x10 >> 0x1b < *(uint *)&pNVar3->field_0x10 >> 0x1b))))
          break;
        }
      }
      pCuts[(ulong)uVar1 - 1] = pNVar3;
      pCuts[uVar1] = pNVar2;
      bVar4 = (int)uVar1 < 2;
      uVar1 = uVar1 - 1;
      if (bVar4) break;
    }
  }
  iVar5 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar5 = nCuts + 1U;
  }
  return iVar5;
}

Assistant:

static inline int Nf_SetAddCut( Nf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Nf_SetLastCutContainsArea(pCuts, nCuts);
    Nf_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}